

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString PrintableStringFromOrNull(char *expected)

{
  size_t extraout_RDX;
  long in_RSI;
  SimpleString SVar2;
  SimpleString local_28;
  char *expected_local;
  size_t sVar1;
  
  expected_local = expected;
  if (in_RSI == 0) {
    SVar2 = StringFrom(expected);
    sVar1 = SVar2.bufferSize_;
  }
  else {
    StringFrom((char *)&local_28);
    SimpleString::printable((SimpleString *)expected);
    SimpleString::~SimpleString(&local_28);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = expected;
  return SVar2;
}

Assistant:

SimpleString PrintableStringFromOrNull(const char * expected)
{
    return (expected) ? StringFrom(expected).printable() : StringFrom("(null)");
}